

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableViewPrivate::selectRow(QTableViewPrivate *this,int row,bool anchor)

{
  QPersistentModelIndex *this_00;
  QPersistentModelIndex *this_01;
  QWidget *this_02;
  QAbstractItemModel *pQVar1;
  QHeaderView *this_03;
  QWidgetData *pQVar2;
  Data *pDVar3;
  QRect QVar4;
  QRect QVar5;
  bool bVar6;
  SelectionBehavior SVar7;
  SelectionMode SVar8;
  int iVar9;
  LayoutDirection LVar10;
  int iVar11;
  qsizetype qVar12;
  int iVar13;
  QObject *pQVar14;
  long in_FS_OFFSET;
  QPersistentModelIndex startIndex;
  SelectionFlag local_ec;
  QRect local_d0;
  QRect local_c0;
  undefined1 local_b0 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QArrayData *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  SVar7 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this_02);
  QVar5.x2.m_i = local_c0.x2.m_i;
  QVar5.y2.m_i = local_c0.y2.m_i;
  QVar5.x1.m_i = local_c0.x1.m_i;
  QVar5.y1.m_i = local_c0.y1.m_i;
  QVar4.x2.m_i = local_d0.x2.m_i;
  QVar4.y2.m_i = local_d0.y2.m_i;
  QVar4.x1.m_i = local_d0.x1.m_i;
  QVar4.y1.m_i = local_d0.y1.m_i;
  if (SVar7 != SelectColumns) {
    SVar8 = QAbstractItemView::selectionMode((QAbstractItemView *)this_02);
    if (SVar8 == SingleSelection) {
      SVar7 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this_02);
      QVar5.x2.m_i = local_c0.x2.m_i;
      QVar5.y2.m_i = local_c0.y2.m_i;
      QVar5.x1.m_i = local_c0.x1.m_i;
      QVar5.y1.m_i = local_c0.y1.m_i;
      QVar4.x2.m_i = local_d0.x2.m_i;
      QVar4.y2.m_i = local_d0.y2.m_i;
      QVar4.x1.m_i = local_d0.x1.m_i;
      QVar4.y1.m_i = local_d0.y1.m_i;
      if (SVar7 == SelectItems) goto LAB_00597dd9;
    }
    QVar5.x2.m_i = local_c0.x2.m_i;
    QVar5.y2.m_i = local_c0.y2.m_i;
    QVar5.x1.m_i = local_c0.x1.m_i;
    QVar5.y1.m_i = local_c0.y1.m_i;
    QVar4.x2.m_i = local_d0.x2.m_i;
    QVar4.y2.m_i = local_d0.y2.m_i;
    QVar4.x1.m_i = local_d0.x1.m_i;
    QVar4.y1.m_i = local_d0.y1.m_i;
    if (-1 < row) {
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      this_00 = &(this->super_QAbstractItemViewPrivate).root;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      iVar9 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1);
      QVar5.x2.m_i = local_c0.x2.m_i;
      QVar5.y2.m_i = local_c0.y2.m_i;
      QVar5.x1.m_i = local_c0.x1.m_i;
      QVar5.y1.m_i = local_c0.y1.m_i;
      QVar4.x2.m_i = local_d0.x2.m_i;
      QVar4.y2.m_i = local_d0.y2.m_i;
      QVar4.x1.m_i = local_d0.x1.m_i;
      QVar4.y1.m_i = local_d0.y1.m_i;
      if (row < iVar9) {
        this_03 = this->horizontalHeader;
        LVar10 = QWidget::layoutDirection(this_02);
        iVar9 = 0;
        if (LVar10 == RightToLeft) {
          pQVar2 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                   )->data;
          iVar9 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
        }
        iVar9 = QHeaderView::logicalIndexAt(this_03,iVar9);
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,row,iVar9,&local_78);
        local_ec = (**(code **)(*(long *)this_02 + 0x2e8))(this_02,&local_58,0);
        local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        this_01 = &(this->super_QAbstractItemViewPrivate).currentSelectionStartIndex;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_78,this_01);
        pQVar14 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
        (**(code **)(*(long *)pQVar14 + 0x60))(pQVar14,&local_58,0);
        QPersistentModelIndex::operator=(this_01,(QPersistentModelIndex *)&local_78);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
        if (((anchor) && ((local_ec & Current) == NoUpdate)) ||
           (SVar8 = QAbstractItemView::selectionMode((QAbstractItemView *)this_02),
           SVar8 == SingleSelection)) {
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
          (**(code **)(*(long *)pQVar1 + 0x60))
                    ((QModelIndex *)&local_78,pQVar1,row,iVar9,(QModelIndex *)&local_98);
          QPersistentModelIndex::operator=(this_01,(QModelIndex *)&local_78);
        }
        SVar8 = QAbstractItemView::selectionMode((QAbstractItemView *)this_02);
        if ((SVar8 != SingleSelection) && ((local_ec & Toggle) != NoUpdate)) {
          if (anchor) {
            QAbstractItemView::selectionModel((QAbstractItemView *)this->verticalHeader);
            QItemSelectionModel::selectedRows((int)(QList<QModelIndex> *)&local_78);
            qVar12 = QtPrivate::indexOf<QModelIndex,QModelIndex>
                               ((QList<QModelIndex> *)&local_78,(QModelIndex *)&local_58,0);
            (this->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag =
                 (uint)(qVar12 != -1) * 2 + Select;
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,0x18,0x10);
              }
            }
            local_ec = local_ec & ~Toggle |
                       (this->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag;
          }
          else {
            local_ec = local_ec & ~ToggleCurrent |
                       (this->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag | Current;
          }
        }
        iVar11 = QPersistentModelIndex::row();
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
        iVar13 = row;
        if (iVar11 < row) {
          iVar13 = iVar11;
        }
        if (row < iVar11) {
          row = iVar11;
        }
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar13,iVar9,&local_98);
        local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_b0,this_00);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_98,pQVar1,row,iVar9,local_b0);
        bVar6 = QHeaderView::sectionsMoved(this->verticalHeader);
        if (bVar6) {
          if ((int)local_78 != (int)local_98) {
            local_c0 = (QRect)(**(code **)(*(long *)this_02 + 0x1e0))(this_02,&local_78);
            local_d0 = (QRect)(**(code **)(*(long *)this_02 + 0x1e0))(this_02,&local_98);
            local_b0 = QRect::operator|(&local_c0,&local_d0);
            (**(code **)(*(long *)this_02 + 0x2c8))(this_02,local_b0,local_ec | Rows);
            QVar4 = local_d0;
            QVar5 = local_c0;
            goto LAB_00597dd9;
          }
        }
        pDVar3 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.d;
        if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
          pQVar14 = (QObject *)0x0;
        }
        else {
          pQVar14 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
        }
        QItemSelection::QItemSelection
                  ((QItemSelection *)local_b0,(QModelIndex *)&local_78,(QModelIndex *)&local_98);
        (**(code **)(*(long *)pQVar14 + 0x70))
                  (pQVar14,(QArrayDataPointer<QItemSelectionRange> *)local_b0,local_ec | Rows);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                  ((QArrayDataPointer<QItemSelectionRange> *)local_b0);
        QVar5.x2.m_i = local_c0.x2.m_i;
        QVar5.y2.m_i = local_c0.y2.m_i;
        QVar5.x1.m_i = local_c0.x1.m_i;
        QVar5.y1.m_i = local_c0.y1.m_i;
        QVar4.x2.m_i = local_d0.x2.m_i;
        QVar4.y2.m_i = local_d0.y2.m_i;
        QVar4.x1.m_i = local_d0.x1.m_i;
        QVar4.y1.m_i = local_d0.y1.m_i;
      }
    }
  }
LAB_00597dd9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_d0 = QVar4;
    local_c0 = QVar5;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::selectRow(int row, bool anchor)
{
    Q_Q(QTableView);

    if (q->selectionBehavior() == QTableView::SelectColumns
        || (q->selectionMode() == QTableView::SingleSelection
            && q->selectionBehavior() == QTableView::SelectItems))
        return;

    if (row >= 0 && row < model->rowCount(root)) {
        int column = horizontalHeader->logicalIndexAt(q->isRightToLeft() ? viewport->width() : 0);
        QModelIndex index = model->index(row, column, root);
        QItemSelectionModel::SelectionFlags command = q->selectionCommand(index);

        {
            // currentSelectionStartIndex gets modified inside QAbstractItemView::currentChanged()
            const auto startIndex = currentSelectionStartIndex;
            selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentSelectionStartIndex = startIndex;
        }

        if ((anchor && !(command & QItemSelectionModel::Current))
            || (q->selectionMode() == QTableView::SingleSelection))
            currentSelectionStartIndex = model->index(row, column, root);

        if (q->selectionMode() != QTableView::SingleSelection
            && command.testFlag(QItemSelectionModel::Toggle)) {
            if (anchor)
                ctrlDragSelectionFlag = verticalHeader->selectionModel()->selectedRows(column).contains(index)
                                    ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command &= ~QItemSelectionModel::Toggle;
            command |= ctrlDragSelectionFlag;
            if (!anchor)
                command |= QItemSelectionModel::Current;
        }

        const auto rowSectionAnchor = currentSelectionStartIndex.row();
        QModelIndex upper = model->index(qMin(rowSectionAnchor, row), column, root);
        QModelIndex lower = model->index(qMax(rowSectionAnchor, row), column, root);
        if ((verticalHeader->sectionsMoved() && upper.row() != lower.row())) {
            q->setSelection(q->visualRect(upper) | q->visualRect(lower), command | QItemSelectionModel::Rows);
        } else {
            selectionModel->select(QItemSelection(upper, lower), command | QItemSelectionModel::Rows);
        }
    }
}